

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeLiteGenerator.cxx
# Opt level: O0

void __thiscall
cmExtraCodeLiteGenerator::CreateProjectSourceEntries
          (cmExtraCodeLiteGenerator *this,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>_>_>
          *cFiles,set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *otherFiles,cmXMLWriter *_xml,string *projectPath,cmMakefile *mf,
          string *projectType,string *targetName)

{
  SystemInformation *this_00;
  cmXMLWriter *pcVar1;
  uint uVar2;
  uint uVar3;
  string *psVar4;
  ulong uVar5;
  allocator<char> local_579;
  string local_578;
  allocator<char> local_551;
  string local_550;
  allocator<char> local_529;
  string local_528;
  allocator<char> local_501;
  string local_500;
  allocator<char> local_4d9;
  string local_4d8;
  allocator<char> local_4b1;
  string local_4b0;
  allocator<char> local_489;
  string local_488;
  allocator<char> local_461;
  string local_460;
  string local_440;
  allocator<char> local_419;
  string local_418;
  string local_3f8;
  allocator<char> local_3d1;
  string local_3d0;
  string local_3b0;
  allocator<char> local_389;
  string local_388;
  string local_368;
  allocator<char> local_341;
  string local_340;
  allocator<char> local_319;
  string local_318;
  allocator<char> local_2f1;
  string local_2f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  string local_2b0;
  undefined1 local_290 [8];
  string relapath;
  string local_268;
  allocator<char> local_241;
  string local_240;
  undefined1 local_220 [8];
  string outputPath;
  string local_1f8;
  allocator<char> local_1d1;
  string local_1d0;
  allocator<char> local_1a9;
  string local_1a8;
  allocator<char> local_181;
  string local_180;
  allocator<char> local_159;
  string local_158;
  string local_138;
  allocator<char> local_111;
  string local_110;
  allocator<char> local_e9;
  string local_e8;
  undefined1 local_c8 [8];
  string codeliteCompilerName;
  SystemInformation info;
  string local_98;
  allocator<char> local_61;
  string local_60;
  cmXMLWriter *local_40;
  cmXMLWriter *xml;
  cmMakefile *mf_local;
  string *projectPath_local;
  cmXMLWriter *_xml_local;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *otherFiles_local;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>_>_>
  *cFiles_local;
  cmExtraCodeLiteGenerator *this_local;
  
  local_40 = _xml;
  xml = (cmXMLWriter *)mf;
  mf_local = (cmMakefile *)projectPath;
  projectPath_local = (string *)_xml;
  _xml_local = (cmXMLWriter *)otherFiles;
  otherFiles_local =
       (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)cFiles;
  cFiles_local = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>_>_>
                  *)this;
  FindMatchingHeaderfiles(this,cFiles,otherFiles);
  pcVar1 = local_40;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"VirtualDirectory",&local_61);
  cmXMLWriter::StartElement(pcVar1,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  cmXMLWriter::Attribute<char[4]>(local_40,"Name",(char (*) [4])0x106d7a3);
  CreateFoldersAndFiles
            (this,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>_>_>
                   *)otherFiles_local,local_40,(string *)mf_local);
  cmXMLWriter::EndElement(local_40);
  pcVar1 = local_40;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"VirtualDirectory",
             (allocator<char> *)((long)&info.Implementation + 7));
  cmXMLWriter::StartElement(pcVar1,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator((allocator<char> *)((long)&info.Implementation + 7));
  cmXMLWriter::Attribute<char[8]>(local_40,"Name",(char (*) [8])0x107418c);
  CreateFoldersAndFiles
            (this,(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)_xml_local,local_40,(string *)mf_local);
  cmXMLWriter::EndElement(local_40);
  this_00 = (SystemInformation *)((long)&codeliteCompilerName.field_2 + 8);
  cmsys::SystemInformation::SystemInformation(this_00);
  cmsys::SystemInformation::RunCPUCheck(this_00);
  uVar2 = cmsys::SystemInformation::GetNumberOfLogicalCPU
                    ((SystemInformation *)((long)&codeliteCompilerName.field_2 + 8));
  uVar3 = cmsys::SystemInformation::GetNumberOfPhysicalCPU
                    ((SystemInformation *)((long)&codeliteCompilerName.field_2 + 8));
  this->CpuCount = uVar2 * uVar3;
  GetCodeLiteCompilerName_abi_cxx11_((string *)local_c8,this,(cmMakefile *)xml);
  pcVar1 = local_40;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"Settings",&local_e9);
  cmXMLWriter::StartElement(pcVar1,&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator(&local_e9);
  cmXMLWriter::Attribute<std::__cxx11::string>(local_40,"Type",projectType);
  pcVar1 = local_40;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_110,"Configuration",&local_111);
  cmXMLWriter::StartElement(pcVar1,&local_110);
  std::__cxx11::string::~string((string *)&local_110);
  std::allocator<char>::~allocator(&local_111);
  cmXMLWriter::Attribute<std::__cxx11::string>(local_40,"Name",&this->ConfigName);
  pcVar1 = local_40;
  GetCodeLiteCompilerName_abi_cxx11_(&local_138,this,(cmMakefile *)xml);
  cmXMLWriter::Attribute<std::__cxx11::string>(pcVar1,"CompilerType",&local_138);
  std::__cxx11::string::~string((string *)&local_138);
  cmXMLWriter::Attribute<char[17]>(local_40,"DebuggerType",(char (*) [17])"GNU gdb debugger");
  cmXMLWriter::Attribute<std::__cxx11::string>(local_40,"Type",projectType);
  cmXMLWriter::Attribute<char[7]>(local_40,"BuildCmpWithGlobalSettings",(char (*) [7])0x104caaa);
  cmXMLWriter::Attribute<char[7]>(local_40,"BuildLnkWithGlobalSettings",(char (*) [7])0x104caaa);
  cmXMLWriter::Attribute<char[7]>(local_40,"BuildResWithGlobalSettings",(char (*) [7])0x104caaa);
  pcVar1 = local_40;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,"Compiler",&local_159);
  cmXMLWriter::StartElement(pcVar1,&local_158);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator(&local_159);
  cmXMLWriter::Attribute<char[3]>(local_40,"Options",(char (*) [3])"-g");
  cmXMLWriter::Attribute<char[4]>(local_40,"Required",(char (*) [4])"yes");
  cmXMLWriter::Attribute<char[1]>(local_40,"PreCompiledHeader",(char (*) [1])0x10b83c7);
  pcVar1 = local_40;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_180,"IncludePath",&local_181);
  cmXMLWriter::StartElement(pcVar1,&local_180);
  std::__cxx11::string::~string((string *)&local_180);
  std::allocator<char>::~allocator(&local_181);
  cmXMLWriter::Attribute<char[2]>(local_40,"Value",(char (*) [2])0x103c0c8);
  cmXMLWriter::EndElement(local_40);
  cmXMLWriter::EndElement(local_40);
  pcVar1 = local_40;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a8,"Linker",&local_1a9);
  cmXMLWriter::StartElement(pcVar1,&local_1a8);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::allocator<char>::~allocator(&local_1a9);
  cmXMLWriter::Attribute<char[1]>(local_40,"Options",(char (*) [1])0x10b83c7);
  cmXMLWriter::Attribute<char[4]>(local_40,"Required",(char (*) [4])"yes");
  cmXMLWriter::EndElement(local_40);
  pcVar1 = local_40;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d0,"ResourceCompiler",&local_1d1);
  cmXMLWriter::StartElement(pcVar1,&local_1d0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::allocator<char>::~allocator(&local_1d1);
  cmXMLWriter::Attribute<char[1]>(local_40,"Options",(char (*) [1])0x10b83c7);
  cmXMLWriter::Attribute<char[3]>(local_40,"Required",(char (*) [3])0x10b753a);
  cmXMLWriter::EndElement(local_40);
  pcVar1 = local_40;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f8,"General",
             (allocator<char> *)(outputPath.field_2._M_local_buf + 0xf));
  cmXMLWriter::StartElement(pcVar1,&local_1f8);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::allocator<char>::~allocator((allocator<char> *)(outputPath.field_2._M_local_buf + 0xf));
  pcVar1 = xml;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_240,"CMAKE_RUNTIME_OUTPUT_DIRECTORY",&local_241);
  psVar4 = cmMakefile::GetSafeDefinition((cmMakefile *)pcVar1,&local_240);
  std::__cxx11::string::string((string *)local_220,(string *)psVar4);
  std::__cxx11::string::~string((string *)&local_240);
  std::allocator<char>::~allocator(&local_241);
  uVar5 = std::__cxx11::string::empty();
  pcVar1 = xml;
  if ((uVar5 & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_268,"EXECUTABLE_OUTPUT_PATH",
               (allocator<char> *)(relapath.field_2._M_local_buf + 0xf));
    psVar4 = cmMakefile::GetSafeDefinition((cmMakefile *)pcVar1,&local_268);
    std::__cxx11::string::operator=((string *)local_220,(string *)psVar4);
    std::__cxx11::string::~string((string *)&local_268);
    std::allocator<char>::~allocator((allocator<char> *)(relapath.field_2._M_local_buf + 0xf));
  }
  std::__cxx11::string::string((string *)local_290);
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) == 0) {
    cmSystemTools::RelativePath(&local_2b0,(string *)mf_local,(string *)local_220);
    std::__cxx11::string::operator=((string *)local_290,(string *)&local_2b0);
    std::__cxx11::string::~string((string *)&local_2b0);
    pcVar1 = local_40;
    std::operator+(&local_2d0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_290,
                   "/$(ProjectName)");
    cmXMLWriter::Attribute<std::__cxx11::string>(pcVar1,"OutputFile",&local_2d0);
    std::__cxx11::string::~string((string *)&local_2d0);
  }
  else {
    cmXMLWriter::Attribute<char[40]>
              (local_40,"OutputFile",(char (*) [40])"$(IntermediateDirectory)/$(ProjectName)");
  }
  cmXMLWriter::Attribute<char[3]>(local_40,"IntermediateDirectory",(char (*) [3])0x103f0af);
  cmXMLWriter::Attribute<char[17]>(local_40,"Command",(char (*) [17])"./$(ProjectName)");
  cmXMLWriter::Attribute<char[1]>(local_40,"CommandArguments",(char (*) [1])0x10b83c7);
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) == 0) {
    cmXMLWriter::Attribute<std::__cxx11::string>
              (local_40,"WorkingDirectory",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_290);
  }
  else {
    cmXMLWriter::Attribute<char[25]>
              (local_40,"WorkingDirectory",(char (*) [25])"$(IntermediateDirectory)");
  }
  cmXMLWriter::Attribute<char[4]>(local_40,"PauseExecWhenProcTerminates",(char (*) [4])"yes");
  cmXMLWriter::EndElement(local_40);
  pcVar1 = local_40;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2f0,"Debugger",&local_2f1);
  cmXMLWriter::StartElement(pcVar1,&local_2f0);
  std::__cxx11::string::~string((string *)&local_2f0);
  std::allocator<char>::~allocator(&local_2f1);
  cmXMLWriter::Attribute<char[3]>(local_40,"IsRemote",(char (*) [3])0x10b753a);
  cmXMLWriter::Attribute<char[1]>(local_40,"RemoteHostName",(char (*) [1])0x10b83c7);
  cmXMLWriter::Attribute<char[1]>(local_40,"RemoteHostPort",(char (*) [1])0x10b83c7);
  cmXMLWriter::Attribute<char[1]>(local_40,"DebuggerPath",(char (*) [1])0x10b83c7);
  cmXMLWriter::Element(local_40,"PostConnectCommands");
  cmXMLWriter::Element(local_40,"StartupCommands");
  cmXMLWriter::EndElement(local_40);
  cmXMLWriter::Element(local_40,"PreBuild");
  cmXMLWriter::Element(local_40,"PostBuild");
  pcVar1 = local_40;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_318,"CustomBuild",&local_319);
  cmXMLWriter::StartElement(pcVar1,&local_318);
  std::__cxx11::string::~string((string *)&local_318);
  std::allocator<char>::~allocator(&local_319);
  cmXMLWriter::Attribute<char[4]>(local_40,"Enabled",(char (*) [4])"yes");
  pcVar1 = local_40;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_340,"RebuildCommand",&local_341);
  GetRebuildCommand(&local_368,this,(cmMakefile *)xml,targetName);
  cmXMLWriter::Element<std::__cxx11::string>(pcVar1,&local_340,&local_368);
  std::__cxx11::string::~string((string *)&local_368);
  std::__cxx11::string::~string((string *)&local_340);
  std::allocator<char>::~allocator(&local_341);
  pcVar1 = local_40;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_388,"CleanCommand",&local_389)
  ;
  GetCleanCommand(&local_3b0,this,(cmMakefile *)xml,targetName);
  cmXMLWriter::Element<std::__cxx11::string>(pcVar1,&local_388,&local_3b0);
  std::__cxx11::string::~string((string *)&local_3b0);
  std::__cxx11::string::~string((string *)&local_388);
  std::allocator<char>::~allocator(&local_389);
  pcVar1 = local_40;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3d0,"BuildCommand",&local_3d1)
  ;
  GetBuildCommand(&local_3f8,this,(cmMakefile *)xml,targetName);
  cmXMLWriter::Element<std::__cxx11::string>(pcVar1,&local_3d0,&local_3f8);
  std::__cxx11::string::~string((string *)&local_3f8);
  std::__cxx11::string::~string((string *)&local_3d0);
  std::allocator<char>::~allocator(&local_3d1);
  pcVar1 = local_40;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_418,"SingleFileCommand",&local_419);
  GetSingleFileBuildCommand_abi_cxx11_(&local_440,this,(cmMakefile *)xml);
  cmXMLWriter::Element<std::__cxx11::string>(pcVar1,&local_418,&local_440);
  std::__cxx11::string::~string((string *)&local_440);
  std::__cxx11::string::~string((string *)&local_418);
  std::allocator<char>::~allocator(&local_419);
  cmXMLWriter::Element(local_40,"PreprocessFileCommand");
  pcVar1 = local_40;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_460,"WorkingDirectory",&local_461);
  cmXMLWriter::Element<char[17]>(pcVar1,&local_460,(char (*) [17])"$(WorkspacePath)");
  std::__cxx11::string::~string((string *)&local_460);
  std::allocator<char>::~allocator(&local_461);
  cmXMLWriter::EndElement(local_40);
  pcVar1 = local_40;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_488,"AdditionalRules",&local_489);
  cmXMLWriter::StartElement(pcVar1,&local_488);
  std::__cxx11::string::~string((string *)&local_488);
  std::allocator<char>::~allocator(&local_489);
  cmXMLWriter::Element(local_40,"CustomPostBuild");
  cmXMLWriter::Element(local_40,"CustomPreBuild");
  cmXMLWriter::EndElement(local_40);
  cmXMLWriter::EndElement(local_40);
  pcVar1 = local_40;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4b0,"GlobalSettings",&local_4b1);
  cmXMLWriter::StartElement(pcVar1,&local_4b0);
  std::__cxx11::string::~string((string *)&local_4b0);
  std::allocator<char>::~allocator(&local_4b1);
  pcVar1 = local_40;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4d8,"Compiler",&local_4d9);
  cmXMLWriter::StartElement(pcVar1,&local_4d8);
  std::__cxx11::string::~string((string *)&local_4d8);
  std::allocator<char>::~allocator(&local_4d9);
  cmXMLWriter::Attribute<char[1]>(local_40,"Options",(char (*) [1])0x10b83c7);
  pcVar1 = local_40;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_500,"IncludePath",&local_501);
  cmXMLWriter::StartElement(pcVar1,&local_500);
  std::__cxx11::string::~string((string *)&local_500);
  std::allocator<char>::~allocator(&local_501);
  cmXMLWriter::Attribute<char[2]>(local_40,"Value",(char (*) [2])0x103c0c8);
  cmXMLWriter::EndElement(local_40);
  cmXMLWriter::EndElement(local_40);
  pcVar1 = local_40;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_528,"Linker",&local_529);
  cmXMLWriter::StartElement(pcVar1,&local_528);
  std::__cxx11::string::~string((string *)&local_528);
  std::allocator<char>::~allocator(&local_529);
  cmXMLWriter::Attribute<char[1]>(local_40,"Options",(char (*) [1])0x10b83c7);
  pcVar1 = local_40;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_550,"LibraryPath",&local_551);
  cmXMLWriter::StartElement(pcVar1,&local_550);
  std::__cxx11::string::~string((string *)&local_550);
  std::allocator<char>::~allocator(&local_551);
  cmXMLWriter::Attribute<char[2]>(local_40,"Value",(char (*) [2])0x103c0c8);
  cmXMLWriter::EndElement(local_40);
  cmXMLWriter::EndElement(local_40);
  pcVar1 = local_40;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_578,"ResourceCompiler",&local_579);
  cmXMLWriter::StartElement(pcVar1,&local_578);
  std::__cxx11::string::~string((string *)&local_578);
  std::allocator<char>::~allocator(&local_579);
  cmXMLWriter::Attribute<char[1]>(local_40,"Options",(char (*) [1])0x10b83c7);
  cmXMLWriter::EndElement(local_40);
  cmXMLWriter::EndElement(local_40);
  cmXMLWriter::EndElement(local_40);
  std::__cxx11::string::~string((string *)local_290);
  std::__cxx11::string::~string((string *)local_220);
  std::__cxx11::string::~string((string *)local_c8);
  cmsys::SystemInformation::~SystemInformation
            ((SystemInformation *)((long)&codeliteCompilerName.field_2 + 8));
  return;
}

Assistant:

void cmExtraCodeLiteGenerator::CreateProjectSourceEntries(
  std::map<std::string, cmSourceFile*>& cFiles,
  std::set<std::string>& otherFiles, cmXMLWriter* _xml,
  const std::string& projectPath, const cmMakefile* mf,
  const std::string& projectType, const std::string& targetName)
{
  cmXMLWriter& xml(*_xml);
  this->FindMatchingHeaderfiles(cFiles, otherFiles);
  // Create 2 virtual folders: src and include
  // and place all the implementation files into the src
  // folder, the rest goes to the include folder
  xml.StartElement("VirtualDirectory");
  xml.Attribute("Name", "src");

  // insert all source files in the codelite project
  // first the C/C++ implementation files, then all others
  this->CreateFoldersAndFiles(cFiles, xml, projectPath);
  xml.EndElement(); // VirtualDirectory

  xml.StartElement("VirtualDirectory");
  xml.Attribute("Name", "include");
  this->CreateFoldersAndFiles(otherFiles, xml, projectPath);
  xml.EndElement(); // VirtualDirectory

  // Get the number of CPUs. We use this information for the make -jN
  // command
  cmsys::SystemInformation info;
  info.RunCPUCheck();

  this->CpuCount =
    info.GetNumberOfLogicalCPU() * info.GetNumberOfPhysicalCPU();

  std::string codeliteCompilerName = this->GetCodeLiteCompilerName(mf);

  xml.StartElement("Settings");
  xml.Attribute("Type", projectType);

  xml.StartElement("Configuration");
  xml.Attribute("Name", this->ConfigName);
  xml.Attribute("CompilerType", this->GetCodeLiteCompilerName(mf));
  xml.Attribute("DebuggerType", "GNU gdb debugger");
  xml.Attribute("Type", projectType);
  xml.Attribute("BuildCmpWithGlobalSettings", "append");
  xml.Attribute("BuildLnkWithGlobalSettings", "append");
  xml.Attribute("BuildResWithGlobalSettings", "append");

  xml.StartElement("Compiler");
  xml.Attribute("Options", "-g");
  xml.Attribute("Required", "yes");
  xml.Attribute("PreCompiledHeader", "");
  xml.StartElement("IncludePath");
  xml.Attribute("Value", ".");
  xml.EndElement(); // IncludePath
  xml.EndElement(); // Compiler

  xml.StartElement("Linker");
  xml.Attribute("Options", "");
  xml.Attribute("Required", "yes");
  xml.EndElement(); // Linker

  xml.StartElement("ResourceCompiler");
  xml.Attribute("Options", "");
  xml.Attribute("Required", "no");
  xml.EndElement(); // ResourceCompiler

  xml.StartElement("General");
  std::string outputPath =
    mf->GetSafeDefinition("CMAKE_RUNTIME_OUTPUT_DIRECTORY");
  if (outputPath.empty()) {
    outputPath = mf->GetSafeDefinition("EXECUTABLE_OUTPUT_PATH");
  }
  std::string relapath;
  if (!outputPath.empty()) {
    relapath = cmSystemTools::RelativePath(projectPath, outputPath);
    xml.Attribute("OutputFile", relapath + "/$(ProjectName)");
  } else {
    xml.Attribute("OutputFile", "$(IntermediateDirectory)/$(ProjectName)");
  }
  xml.Attribute("IntermediateDirectory", "./");
  xml.Attribute("Command", "./$(ProjectName)");
  xml.Attribute("CommandArguments", "");
  if (!outputPath.empty()) {
    xml.Attribute("WorkingDirectory", relapath);
  } else {
    xml.Attribute("WorkingDirectory", "$(IntermediateDirectory)");
  }
  xml.Attribute("PauseExecWhenProcTerminates", "yes");
  xml.EndElement(); // General

  xml.StartElement("Debugger");
  xml.Attribute("IsRemote", "no");
  xml.Attribute("RemoteHostName", "");
  xml.Attribute("RemoteHostPort", "");
  xml.Attribute("DebuggerPath", "");
  xml.Element("PostConnectCommands");
  xml.Element("StartupCommands");
  xml.EndElement(); // Debugger

  xml.Element("PreBuild");
  xml.Element("PostBuild");

  xml.StartElement("CustomBuild");
  xml.Attribute("Enabled", "yes");
  xml.Element("RebuildCommand", this->GetRebuildCommand(mf, targetName));
  xml.Element("CleanCommand", this->GetCleanCommand(mf, targetName));
  xml.Element("BuildCommand", this->GetBuildCommand(mf, targetName));
  xml.Element("SingleFileCommand", this->GetSingleFileBuildCommand(mf));
  xml.Element("PreprocessFileCommand");
  xml.Element("WorkingDirectory", "$(WorkspacePath)");
  xml.EndElement(); // CustomBuild

  xml.StartElement("AdditionalRules");
  xml.Element("CustomPostBuild");
  xml.Element("CustomPreBuild");
  xml.EndElement(); // AdditionalRules

  xml.EndElement(); // Configuration
  xml.StartElement("GlobalSettings");

  xml.StartElement("Compiler");
  xml.Attribute("Options", "");
  xml.StartElement("IncludePath");
  xml.Attribute("Value", ".");
  xml.EndElement(); // IncludePath
  xml.EndElement(); // Compiler

  xml.StartElement("Linker");
  xml.Attribute("Options", "");
  xml.StartElement("LibraryPath");
  xml.Attribute("Value", ".");
  xml.EndElement(); // LibraryPath
  xml.EndElement(); // Linker

  xml.StartElement("ResourceCompiler");
  xml.Attribute("Options", "");
  xml.EndElement(); // ResourceCompiler

  xml.EndElement(); // GlobalSettings
  xml.EndElement(); // Settings
}